

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int resolveSelectStep(Walker *pWalker,Select *p)

{
  byte *pbVar1;
  u8 uVar2;
  Parse *pParse;
  NameContext *pOuterNC;
  SrcList *pSVar3;
  Select *pSVar4;
  char *pcVar5;
  ExprList *pEVar6;
  Window *pWVar7;
  Parse *pParse_00;
  anon_union_8_3_1bb8468b_for_uNC aVar8;
  Expr *pEVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  NameContext *pNVar15;
  Expr *p_00;
  Expr *pEVar16;
  ulong uVar17;
  ExprList_item *pEVar18;
  ulong uVar19;
  Expr *pE;
  Expr *pEVar20;
  ulong uVar21;
  long lVar22;
  Window **ppWVar23;
  sqlite3 *psVar24;
  char *pcVar25;
  long lVar26;
  ExprList_item *pEVar27;
  Select *pSVar28;
  Select *pSVar29;
  bool bVar30;
  NameContext sNC;
  int local_d4;
  Expr *local_d0;
  int local_b4;
  NameContext local_b0;
  sqlite3 *local_78;
  ExprList_item *local_70;
  NameContext local_68;
  
  iVar11 = 1;
  if ((p->selFlags & 4) == 0) {
    pParse = pWalker->pParse;
    pOuterNC = (pWalker->u).pNC;
    psVar24 = pParse->db;
    if ((p->selFlags & 0x40) == 0) {
      sqlite3SelectPrep(pParse,p,pOuterNC);
      iVar11 = 2;
      if (pParse->nErr == 0) {
        iVar11 = 2 - (uint)(psVar24->mallocFailed == '\0');
      }
    }
    else {
      pSVar29 = p->pPrior;
      local_d4 = 0;
      for (pSVar28 = p; pSVar28 != (Select *)0x0; pSVar28 = pSVar28->pPrior) {
        *(byte *)&pSVar28->selFlags = (byte)pSVar28->selFlags | 4;
        local_b0.pNext = (NameContext *)0x0;
        local_b0.nRef = 0;
        local_b0.nErr = 0;
        local_b0.ncFlags = 0;
        local_b0._44_4_ = 0;
        local_b0.pSrcList = (SrcList *)0x0;
        local_b0.uNC.pEList = (ExprList *)0x0;
        local_b0.pParse = pParse;
        local_b0.pWinSelect = pSVar28;
        iVar11 = sqlite3ResolveExprNames(&local_b0,pSVar28->pLimit);
        if (iVar11 != 0) goto LAB_00193bf3;
        if ((pSVar28->selFlags & 0x10000) != 0) {
          (pSVar28->pSrc->a[0].pSelect)->pOrderBy = pSVar28->pOrderBy;
          pSVar28->pOrderBy = (ExprList *)0x0;
        }
        for (lVar26 = 0; pSVar3 = pSVar28->pSrc, lVar26 < pSVar3->nSrc; lVar26 = lVar26 + 1) {
          pSVar4 = pSVar3->a[lVar26].pSelect;
          if ((pSVar4 != (Select *)0x0) && ((pSVar4->selFlags & 4) == 0)) {
            pcVar25 = pParse->zAuthContext;
            iVar11 = 0;
            for (pNVar15 = pOuterNC; pNVar15 != (NameContext *)0x0; pNVar15 = pNVar15->pNext) {
              iVar11 = iVar11 + pNVar15->nRef;
            }
            pcVar5 = pSVar3->a[lVar26].zName;
            if (pcVar5 != (char *)0x0) {
              pParse->zAuthContext = pcVar5;
            }
            sqlite3ResolveSelectNames(pParse,pSVar4,pOuterNC);
            pParse->zAuthContext = pcVar25;
            if ((pParse->nErr != 0) || (pNVar15 = pOuterNC, psVar24->mallocFailed != '\0'))
            goto LAB_00193bf3;
            for (; pNVar15 != (NameContext *)0x0; pNVar15 = pNVar15->pNext) {
              iVar11 = iVar11 - pNVar15->nRef;
            }
            pSVar3->a[lVar26].fg.field_0x1 =
                 pSVar3->a[lVar26].fg.field_0x1 & 0xf7 | (iVar11 != 0) << 3;
          }
        }
        local_b0.ncFlags = 0x4001;
        local_b0.pSrcList = pSVar3;
        local_b0.pNext = pOuterNC;
        iVar11 = sqlite3ResolveExprListNames(&local_b0,pSVar28->pEList);
        if (iVar11 != 0) goto LAB_00193bf3;
        uVar12 = local_b0.ncFlags & 0xffffbfff;
        pEVar6 = pSVar28->pGroupBy;
        if ((byte)((byte)((local_b0.ncFlags & 0x10U) >> 4) | pEVar6 != (ExprList *)0x0) == 1) {
          pSVar28->selFlags = local_b0.ncFlags & 0x1000U | pSVar28->selFlags | 8;
        }
        else {
          uVar12 = local_b0.ncFlags & 0xffffbfee;
        }
        local_b0.ncFlags = uVar12;
        if (pSVar28->pHaving != (Expr *)0x0 && pEVar6 == (ExprList *)0x0) {
          pcVar25 = "a GROUP BY clause is required before HAVING";
          goto LAB_00193bec;
        }
        local_b0.uNC.pEList = pSVar28->pEList;
        local_b0._40_8_ = CONCAT44(local_b0._44_4_,uVar12) | 0x80;
        iVar11 = sqlite3ResolveExprNames(&local_b0,pSVar28->pHaving);
        if ((iVar11 != 0) ||
           (iVar11 = sqlite3ResolveExprNames(&local_b0,pSVar28->pWhere), iVar11 != 0))
        goto LAB_00193bf3;
        lVar26 = 0x68;
        for (lVar22 = 0; pSVar3 = pSVar28->pSrc, lVar22 < pSVar3->nSrc; lVar22 = lVar22 + 1) {
          if (((*(byte *)((long)pSVar3->a + lVar26 + -0x2b) & 4) != 0) &&
             (iVar11 = sqlite3ResolveExprListNames
                                 (&local_b0,*(ExprList **)((long)pSVar3->a + lVar26 + -8)),
             iVar11 != 0)) goto LAB_00193bf3;
          lVar26 = lVar26 + 0x70;
        }
        local_b0.pNext = (NameContext *)0x0;
        local_b0._40_8_ = local_b0._40_8_ | 0x4001;
        if ((pSVar28->selFlags & 0x10000) != 0) {
          pSVar4 = pSVar3->a[0].pSelect;
          pSVar28->pOrderBy = pSVar4->pOrderBy;
          pSVar4->pOrderBy = (ExprList *)0x0;
        }
        if (((pSVar29 == (Select *)0x0 || local_d4 != 0) &&
            (iVar11 = resolveOrderGroupBy(&local_b0,pSVar28,pSVar28->pOrderBy,"ORDER"), iVar11 != 0)
            ) || (psVar24->mallocFailed != '\0')) goto LAB_00193bf3;
        local_b0._40_8_ = local_b0._40_8_ & 0xffffffffffffbfff;
        if (pEVar6 != (ExprList *)0x0) {
          iVar11 = resolveOrderGroupBy(&local_b0,pSVar28,pEVar6,"GROUP");
          if ((iVar11 != 0) || (psVar24->mallocFailed != '\0')) goto LAB_00193bf3;
          iVar11 = pEVar6->nExpr;
          pEVar27 = pEVar6->a;
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          while (bVar30 = iVar11 != 0, iVar11 = iVar11 + -1, bVar30) {
            if ((pEVar27->pExpr->flags & 0x10) != 0) {
              pcVar25 = "aggregate functions are not allowed in the GROUP BY clause";
              goto LAB_00193bec;
            }
            pEVar27 = pEVar27 + 1;
          }
        }
        if (1 < pParse->eParseMode) {
          ppWVar23 = &pSVar28->pWinDefn;
          while (pWVar7 = *ppWVar23, pWVar7 != (Window *)0x0) {
            iVar11 = sqlite3ResolveExprListNames(&local_b0,pWVar7->pOrderBy);
            if (iVar11 != 0) goto LAB_00193bf3;
            iVar11 = sqlite3ResolveExprListNames(&local_b0,pWVar7->pPartition);
            ppWVar23 = &pWVar7->pNextWin;
            if (iVar11 != 0) goto LAB_00193bf3;
          }
        }
        pSVar4 = pSVar28->pNext;
        if ((pSVar4 != (Select *)0x0) && (pSVar28->pEList->nExpr != pSVar4->pEList->nExpr)) {
          if ((pSVar4->selFlags & 0x200) == 0) {
            uVar17 = (ulong)pSVar4->op ^ 0x80;
            if ((byte)uVar17 < 3) {
              pcVar25 = (&PTR_anon_var_dwarf_7038d_00203d98)[uVar17];
            }
            else {
              pcVar25 = "UNION";
            }
            sqlite3ErrorMsg(pParse,
                            "SELECTs to the left and right of %s do not have the same number of result columns"
                            ,pcVar25);
            return 2;
          }
          pcVar25 = "all VALUES must have the same number of terms";
          goto LAB_00193bec;
        }
        local_d4 = local_d4 + 1;
      }
      if (pSVar29 == (Select *)0x0) {
        iVar11 = 1;
      }
      else {
        pEVar6 = p->pOrderBy;
        iVar11 = 1;
        if (pEVar6 != (ExprList *)0x0) {
          psVar24 = pParse->db;
          uVar12 = pEVar6->nExpr;
          if (psVar24->aLimit[2] < (int)uVar12) {
            pcVar25 = "too many terms in ORDER BY clause";
LAB_00193bec:
            sqlite3ErrorMsg(pParse,pcVar25);
LAB_00193bf3:
            iVar11 = 2;
          }
          else {
            local_70 = pEVar6->a;
            lVar26 = 0;
            uVar17 = 0;
            if (0 < (int)uVar12) {
              uVar17 = (ulong)uVar12;
            }
            for (; uVar17 * 0x20 != lVar26; lVar26 = lVar26 + 0x20) {
              pbVar1 = &pEVar6->a[0].field_0x19 + lVar26;
              *pbVar1 = *pbVar1 & 0xfe;
            }
            pSVar29 = (Select *)0x0;
            do {
              pSVar28 = p;
              pSVar28->pNext = pSVar29;
              p = pSVar28->pPrior;
              pSVar29 = pSVar28;
            } while (pSVar28->pPrior != (Select *)0x0);
            bVar30 = true;
            local_78 = psVar24;
            while ((pSVar28 != (Select *)0x0 && (bVar30))) {
              pParse_00 = (Parse *)pSVar28->pEList;
              bVar30 = false;
              pEVar27 = local_70;
              for (iVar11 = 0; iVar11 < (int)uVar12; iVar11 = iVar11 + 1) {
                local_b4 = -1;
                bVar10 = bVar30;
                if ((pEVar27->field_0x19 & 1) == 0) {
                  p_00 = sqlite3ExprSkipCollate(pEVar27->pExpr);
                  iVar13 = sqlite3ExprIsInteger(p_00,&local_b4);
                  if (iVar13 == 0) {
                    iVar14 = resolveAsName(pParse_00,(ExprList *)p_00,pE);
                    if (iVar14 == 0) {
                      local_d0 = p_00;
                      if (pParse->eParseMode < 2) {
                        local_d0 = sqlite3ExprDup(psVar24,p_00,0);
                      }
                      iVar14 = 0;
                      if (psVar24->mallocFailed == '\0') {
                        aVar8.pEList = pSVar28->pEList;
                        local_68.pWinSelect = (Select *)0x0;
                        local_68.pNext = (NameContext *)0x0;
                        local_68.nRef = 0;
                        local_68.nErr = 0;
                        local_68.pSrcList = pSVar28->pSrc;
                        local_68.ncFlags = 0x81;
                        local_68._44_4_ = 0;
                        psVar24 = pParse->db;
                        uVar2 = psVar24->suppressErr;
                        psVar24->suppressErr = '\x01';
                        local_68.pParse = pParse;
                        local_68.uNC.pEList = aVar8.pEList;
                        iVar13 = sqlite3ResolveExprNames(&local_68,local_d0);
                        psVar24->suppressErr = uVar2;
                        iVar14 = 0;
                        psVar24 = local_78;
                        if (iVar13 == 0) {
                          pEVar18 = (aVar8.pEList)->a;
                          for (lVar26 = 0; psVar24 = local_78, lVar26 < (aVar8.pEList)->nExpr;
                              lVar26 = lVar26 + 1) {
                            uVar12 = sqlite3ExprCompare((Parse *)0x0,pEVar18->pExpr,local_d0,-1);
                            if (uVar12 < 2) {
                              iVar14 = (int)lVar26 + 1;
                              psVar24 = local_78;
                              break;
                            }
                            pEVar18 = pEVar18 + 1;
                          }
                        }
                      }
                      if (pParse->eParseMode < 2) {
                        sqlite3ExprDelete(psVar24,local_d0);
                      }
                    }
                    bVar10 = true;
                    if (iVar14 < 1) goto LAB_00193eb0;
                  }
                  else {
                    iVar13 = *(int *)&pParse_00->db;
                    if ((local_b4 < 1) || (iVar14 = local_b4, iVar13 < local_b4)) {
                      resolveOutOfRangeError(pParse,"ORDER",iVar11 + 1,iVar13);
                      goto LAB_00193bf3;
                    }
                  }
                  if (pParse->eParseMode < 2) {
                    pEVar16 = sqlite3Expr(psVar24,0x93,(char *)0x0);
                    if (pEVar16 == (Expr *)0x0) goto LAB_00193bf3;
                    pbVar1 = (byte *)((long)&pEVar16->flags + 1);
                    *pbVar1 = *pbVar1 | 4;
                    (pEVar16->u).iValue = iVar14;
                    pEVar18 = pEVar27;
                    pEVar9 = pEVar27->pExpr;
                    if (pEVar27->pExpr != p_00) {
                      do {
                        pEVar20 = pEVar9;
                        pEVar9 = pEVar20->pLeft;
                      } while (pEVar9->op == 'j');
                      pEVar18 = (ExprList_item *)&pEVar20->pLeft;
                    }
                    pEVar18->pExpr = pEVar16;
                    sqlite3ExprDelete(psVar24,p_00);
                    (pEVar27->u).x.iOrderByCol = (u16)iVar14;
                  }
                  pEVar27->field_0x19 = pEVar27->field_0x19 | 1;
                  bVar10 = bVar30;
                }
LAB_00193eb0:
                bVar30 = bVar10;
                pEVar27 = pEVar27 + 1;
                uVar12 = pEVar6->nExpr;
              }
              pSVar28 = pSVar28->pNext;
            }
            uVar19 = 0;
            uVar17 = (ulong)uVar12;
            if ((int)uVar12 < 1) {
              uVar17 = uVar19;
            }
            iVar11 = 1;
            uVar21 = 1;
            for (; uVar17 * 0x20 != uVar19; uVar19 = uVar19 + 0x20) {
              if (((&pEVar6->a[0].field_0x19)[uVar19] & 1) == 0) {
                sqlite3ErrorMsg(pParse,
                                "%r ORDER BY term does not match any column in the result set",
                                uVar21);
                goto LAB_00193bf3;
              }
              uVar21 = (ulong)((int)uVar21 + 1);
            }
          }
        }
      }
    }
  }
  return iVar11;
}

Assistant:

static int resolveSelectStep(Walker *pWalker, Select *p){
  NameContext *pOuterNC;  /* Context that contains this SELECT */
  NameContext sNC;        /* Name context of this SELECT */
  int isCompound;         /* True if p is a compound select */
  int nCompound;          /* Number of compound terms processed so far */
  Parse *pParse;          /* Parsing context */
  int i;                  /* Loop counter */
  ExprList *pGroupBy;     /* The GROUP BY clause */
  Select *pLeftmost;      /* Left-most of SELECT of a compound */
  sqlite3 *db;            /* Database connection */
  

  assert( p!=0 );
  if( p->selFlags & SF_Resolved ){
    return WRC_Prune;
  }
  pOuterNC = pWalker->u.pNC;
  pParse = pWalker->pParse;
  db = pParse->db;

  /* Normally sqlite3SelectExpand() will be called first and will have
  ** already expanded this SELECT.  However, if this is a subquery within
  ** an expression, sqlite3ResolveExprNames() will be called without a
  ** prior call to sqlite3SelectExpand().  When that happens, let
  ** sqlite3SelectPrep() do all of the processing for this SELECT.
  ** sqlite3SelectPrep() will invoke both sqlite3SelectExpand() and
  ** this routine in the correct order.
  */
  if( (p->selFlags & SF_Expanded)==0 ){
    sqlite3SelectPrep(pParse, p, pOuterNC);
    return (pParse->nErr || db->mallocFailed) ? WRC_Abort : WRC_Prune;
  }

  isCompound = p->pPrior!=0;
  nCompound = 0;
  pLeftmost = p;
  while( p ){
    assert( (p->selFlags & SF_Expanded)!=0 );
    assert( (p->selFlags & SF_Resolved)==0 );
    p->selFlags |= SF_Resolved;

    /* Resolve the expressions in the LIMIT and OFFSET clauses. These
    ** are not allowed to refer to any names, so pass an empty NameContext.
    */
    memset(&sNC, 0, sizeof(sNC));
    sNC.pParse = pParse;
    sNC.pWinSelect = p;
    if( sqlite3ResolveExprNames(&sNC, p->pLimit) ){
      return WRC_Abort;
    }

    /* If the SF_Converted flags is set, then this Select object was
    ** was created by the convertCompoundSelectToSubquery() function.
    ** In this case the ORDER BY clause (p->pOrderBy) should be resolved
    ** as if it were part of the sub-query, not the parent. This block
    ** moves the pOrderBy down to the sub-query. It will be moved back
    ** after the names have been resolved.  */
    if( p->selFlags & SF_Converted ){
      Select *pSub = p->pSrc->a[0].pSelect;
      assert( p->pSrc->nSrc==1 && p->pOrderBy );
      assert( pSub->pPrior && pSub->pOrderBy==0 );
      pSub->pOrderBy = p->pOrderBy;
      p->pOrderBy = 0;
    }
  
    /* Recursively resolve names in all subqueries
    */
    for(i=0; i<p->pSrc->nSrc; i++){
      struct SrcList_item *pItem = &p->pSrc->a[i];
      if( pItem->pSelect && (pItem->pSelect->selFlags & SF_Resolved)==0 ){
        NameContext *pNC;         /* Used to iterate name contexts */
        int nRef = 0;             /* Refcount for pOuterNC and outer contexts */
        const char *zSavedContext = pParse->zAuthContext;

        /* Count the total number of references to pOuterNC and all of its
        ** parent contexts. After resolving references to expressions in
        ** pItem->pSelect, check if this value has changed. If so, then
        ** SELECT statement pItem->pSelect must be correlated. Set the
        ** pItem->fg.isCorrelated flag if this is the case. */
        for(pNC=pOuterNC; pNC; pNC=pNC->pNext) nRef += pNC->nRef;

        if( pItem->zName ) pParse->zAuthContext = pItem->zName;
        sqlite3ResolveSelectNames(pParse, pItem->pSelect, pOuterNC);
        pParse->zAuthContext = zSavedContext;
        if( pParse->nErr || db->mallocFailed ) return WRC_Abort;

        for(pNC=pOuterNC; pNC; pNC=pNC->pNext) nRef -= pNC->nRef;
        assert( pItem->fg.isCorrelated==0 && nRef<=0 );
        pItem->fg.isCorrelated = (nRef!=0);
      }
    }
  
    /* Set up the local name-context to pass to sqlite3ResolveExprNames() to
    ** resolve the result-set expression list.
    */
    sNC.ncFlags = NC_AllowAgg|NC_AllowWin;
    sNC.pSrcList = p->pSrc;
    sNC.pNext = pOuterNC;
  
    /* Resolve names in the result set. */
    if( sqlite3ResolveExprListNames(&sNC, p->pEList) ) return WRC_Abort;
    sNC.ncFlags &= ~NC_AllowWin;
  
    /* If there are no aggregate functions in the result-set, and no GROUP BY 
    ** expression, do not allow aggregates in any of the other expressions.
    */
    assert( (p->selFlags & SF_Aggregate)==0 );
    pGroupBy = p->pGroupBy;
    if( pGroupBy || (sNC.ncFlags & NC_HasAgg)!=0 ){
      assert( NC_MinMaxAgg==SF_MinMaxAgg );
      p->selFlags |= SF_Aggregate | (sNC.ncFlags&NC_MinMaxAgg);
    }else{
      sNC.ncFlags &= ~NC_AllowAgg;
    }
  
    /* If a HAVING clause is present, then there must be a GROUP BY clause.
    */
    if( p->pHaving && !pGroupBy ){
      sqlite3ErrorMsg(pParse, "a GROUP BY clause is required before HAVING");
      return WRC_Abort;
    }
  
    /* Add the output column list to the name-context before parsing the
    ** other expressions in the SELECT statement. This is so that
    ** expressions in the WHERE clause (etc.) can refer to expressions by
    ** aliases in the result set.
    **
    ** Minor point: If this is the case, then the expression will be
    ** re-evaluated for each reference to it.
    */
    assert( (sNC.ncFlags & (NC_UAggInfo|NC_UUpsert))==0 );
    sNC.uNC.pEList = p->pEList;
    sNC.ncFlags |= NC_UEList;
    if( sqlite3ResolveExprNames(&sNC, p->pHaving) ) return WRC_Abort;
    if( sqlite3ResolveExprNames(&sNC, p->pWhere) ) return WRC_Abort;

    /* Resolve names in table-valued-function arguments */
    for(i=0; i<p->pSrc->nSrc; i++){
      struct SrcList_item *pItem = &p->pSrc->a[i];
      if( pItem->fg.isTabFunc
       && sqlite3ResolveExprListNames(&sNC, pItem->u1.pFuncArg) 
      ){
        return WRC_Abort;
      }
    }

    /* The ORDER BY and GROUP BY clauses may not refer to terms in
    ** outer queries 
    */
    sNC.pNext = 0;
    sNC.ncFlags |= NC_AllowAgg|NC_AllowWin;

    /* If this is a converted compound query, move the ORDER BY clause from 
    ** the sub-query back to the parent query. At this point each term
    ** within the ORDER BY clause has been transformed to an integer value.
    ** These integers will be replaced by copies of the corresponding result
    ** set expressions by the call to resolveOrderGroupBy() below.  */
    if( p->selFlags & SF_Converted ){
      Select *pSub = p->pSrc->a[0].pSelect;
      p->pOrderBy = pSub->pOrderBy;
      pSub->pOrderBy = 0;
    }

    /* Process the ORDER BY clause for singleton SELECT statements.
    ** The ORDER BY clause for compounds SELECT statements is handled
    ** below, after all of the result-sets for all of the elements of
    ** the compound have been resolved.
    **
    ** If there is an ORDER BY clause on a term of a compound-select other
    ** than the right-most term, then that is a syntax error.  But the error
    ** is not detected until much later, and so we need to go ahead and
    ** resolve those symbols on the incorrect ORDER BY for consistency.
    */
    if( isCompound<=nCompound  /* Defer right-most ORDER BY of a compound */
     && resolveOrderGroupBy(&sNC, p, p->pOrderBy, "ORDER")
    ){
      return WRC_Abort;
    }
    if( db->mallocFailed ){
      return WRC_Abort;
    }
    sNC.ncFlags &= ~NC_AllowWin;
  
    /* Resolve the GROUP BY clause.  At the same time, make sure 
    ** the GROUP BY clause does not contain aggregate functions.
    */
    if( pGroupBy ){
      struct ExprList_item *pItem;
    
      if( resolveOrderGroupBy(&sNC, p, pGroupBy, "GROUP") || db->mallocFailed ){
        return WRC_Abort;
      }
      for(i=0, pItem=pGroupBy->a; i<pGroupBy->nExpr; i++, pItem++){
        if( ExprHasProperty(pItem->pExpr, EP_Agg) ){
          sqlite3ErrorMsg(pParse, "aggregate functions are not allowed in "
              "the GROUP BY clause");
          return WRC_Abort;
        }
      }
    }

#ifndef SQLITE_OMIT_WINDOWFUNC
    if( IN_RENAME_OBJECT ){
      Window *pWin;
      for(pWin=p->pWinDefn; pWin; pWin=pWin->pNextWin){
        if( sqlite3ResolveExprListNames(&sNC, pWin->pOrderBy)
         || sqlite3ResolveExprListNames(&sNC, pWin->pPartition)
        ){
          return WRC_Abort;
        }
      }
    }
#endif

    /* If this is part of a compound SELECT, check that it has the right
    ** number of expressions in the select list. */
    if( p->pNext && p->pEList->nExpr!=p->pNext->pEList->nExpr ){
      sqlite3SelectWrongNumTermsError(pParse, p->pNext);
      return WRC_Abort;
    }

    /* Advance to the next term of the compound
    */
    p = p->pPrior;
    nCompound++;
  }

  /* Resolve the ORDER BY on a compound SELECT after all terms of
  ** the compound have been resolved.
  */
  if( isCompound && resolveCompoundOrderBy(pParse, pLeftmost) ){
    return WRC_Abort;
  }

  return WRC_Prune;
}